

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * __thiscall Matrix4f::transposed(Matrix4f *__return_storage_ptr__,Matrix4f *this)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int j;
  int i;
  Matrix4f *this_local;
  Matrix4f *out;
  
  Matrix4f(__return_storage_ptr__,0.0);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      pfVar2 = operator()(this,local_1c,local_20);
      fVar1 = *pfVar2;
      pfVar2 = operator()(__return_storage_ptr__,local_20,local_1c);
      *pfVar2 = fVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::transposed() const
{
	Matrix4f out;
	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
			out( j, i ) = ( *this )( i, j );
		}
	}

	return out;
}